

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsdumper.cpp
# Opt level: O3

USTATUS __thiscall
FfsDumper::dump(FfsDumper *this,UModelIndex *root,CBString *path,DumpMode dumpMode,UINT8 sectionType
               ,CBString *guid)

{
  bool bVar1;
  USTATUS UVar2;
  
  this->dumped = false;
  this->counterRaw = 0;
  this->counterInfo = 0;
  this->counterHeader = 0;
  this->counterBody = 0;
  std::
  _Rb_tree<UModelIndex,_UModelIndex,_std::_Identity<UModelIndex>,_std::less<UModelIndex>,_std::allocator<UModelIndex>_>
  ::clear(&(this->fileList)._M_t);
  bVar1 = changeDirectory(path);
  if (bVar1) {
    printf("Directory \"%s\" already exists.\n",(path->super_tagbstring).data);
    UVar2 = 0x22;
  }
  else {
    Bstrlib::CBString::operator=(&this->currentPath,path);
    UVar2 = recursiveDump(this,root,path,dumpMode,sectionType,guid);
    if (UVar2 == 0) {
      if (this->dumped == false) {
        bVar1 = removeDirectory(path);
        UVar2 = 8;
        if (bVar1) {
          printf("Removed directory \"%s\" since nothing was dumped.\n",
                 (path->super_tagbstring).data);
        }
      }
      else {
        UVar2 = 0;
      }
    }
    else {
      printf("Error %zu returned from recursiveDump (directory \"%s\").\n",UVar2,
             (path->super_tagbstring).data);
    }
  }
  return UVar2;
}

Assistant:

USTATUS FfsDumper::dump(const UModelIndex & root, const UString & path, const DumpMode dumpMode, const UINT8 sectionType, const UString & guid)
{
    dumped = false;
    counterHeader = counterBody = counterRaw = counterInfo = 0;
    fileList.clear();

    if (changeDirectory(path)) {
        printf("Directory \"%s\" already exists.\n", (const char*)path.toLocal8Bit());
        return U_DIR_ALREADY_EXIST;
    }

    currentPath = path;

    USTATUS result = recursiveDump(root, path, dumpMode, sectionType, guid);
    if (result) {
        printf("Error %zu returned from recursiveDump (directory \"%s\").\n", result, (const char*)path.toLocal8Bit());
        return result;
    } else if (!dumped) {
        if (removeDirectory(path)) {
            printf("Removed directory \"%s\" since nothing was dumped.\n", (const char*)path.toLocal8Bit());
        }
        return U_ITEM_NOT_FOUND;
    }

    return U_SUCCESS;
}